

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void check_conflict(LexState *ls,LHS_assign *lh,expdesc *v)

{
  byte bVar1;
  FuncState *fs_00;
  bool bVar2;
  int conflict;
  lu_byte extra;
  FuncState *fs;
  expdesc *v_local;
  LHS_assign *lh_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bVar1 = fs_00->freereg;
  bVar2 = false;
  for (v_local = (expdesc *)lh; v_local != (expdesc *)0x0; v_local = *(expdesc **)v_local) {
    if ((0xb < (uint)(v_local->u).info) && ((uint)(v_local->u).info < 0x10)) {
      if ((v_local->u).info == 0xd) {
        if ((v->k == VUPVAL) && ((uint)*(byte *)((long)&v_local->t + 2) == (v->u).info)) {
          bVar2 = true;
          (v_local->u).info = 0xf;
          *(byte *)((long)&v_local->t + 2) = bVar1;
        }
      }
      else {
        if ((v->k == VLOCAL) && (*(lu_byte *)((long)&v_local->t + 2) == (v->u).var.ridx)) {
          bVar2 = true;
          *(byte *)((long)&v_local->t + 2) = bVar1;
        }
        if ((((v_local->u).info == 0xc) && (v->k == VLOCAL)) &&
           ((ushort)v_local->t == (ushort)(v->u).var.ridx)) {
          bVar2 = true;
          *(ushort *)&v_local->t = (ushort)bVar1;
        }
      }
    }
  }
  if (bVar2) {
    if (v->k == VLOCAL) {
      luaK_codeABCk(fs_00,OP_MOVE,(uint)bVar1,(uint)(v->u).var.ridx,0,0);
    }
    else {
      luaK_codeABCk(fs_00,OP_GETUPVAL,(uint)bVar1,(v->u).info,0,0);
    }
    luaK_reserveregs(fs_00,1);
  }
  return;
}

Assistant:

static void check_conflict (LexState *ls, struct LHS_assign *lh, expdesc *v) {
  FuncState *fs = ls->fs;
  lu_byte extra = fs->freereg;  /* eventual position to save local variable */
  int conflict = 0;
  for (; lh; lh = lh->prev) {  /* check all previous assignments */
    if (vkisindexed(lh->v.k)) {  /* assignment to table field? */
      if (lh->v.k == VINDEXUP) {  /* is table an upvalue? */
        if (v->k == VUPVAL && lh->v.u.ind.t == v->u.info) {
          conflict = 1;  /* table is the upvalue being assigned now */
          lh->v.k = VINDEXSTR;
          lh->v.u.ind.t = extra;  /* assignment will use safe copy */
        }
      }
      else {  /* table is a register */
        if (v->k == VLOCAL && lh->v.u.ind.t == v->u.var.ridx) {
          conflict = 1;  /* table is the local being assigned now */
          lh->v.u.ind.t = extra;  /* assignment will use safe copy */
        }
        /* is index the local being assigned? */
        if (lh->v.k == VINDEXED && v->k == VLOCAL &&
            lh->v.u.ind.idx == v->u.var.ridx) {
          conflict = 1;
          lh->v.u.ind.idx = extra;  /* previous assignment will use safe copy */
        }
      }
    }
  }
  if (conflict) {
    /* copy upvalue/local value to a temporary (in position 'extra') */
    if (v->k == VLOCAL)
      luaK_codeABC(fs, OP_MOVE, extra, v->u.var.ridx, 0);
    else
      luaK_codeABC(fs, OP_GETUPVAL, extra, v->u.info, 0);
    luaK_reserveregs(fs, 1);
  }
}